

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::
GenerateSibling<google::protobuf::compiler::java::MessageGenerator,google::protobuf::Descriptor>
          (java *this,string *package_dir,string *java_package,Descriptor *descriptor,
          GeneratorContext *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *file_list,string *name_suffix,offset_in_MessageGenerator_to_subr pfn)

{
  string *psVar1;
  ZeroCopyOutputStream *pZVar2;
  FileDescriptor *this_00;
  ulong uVar3;
  code *local_178;
  undefined1 local_128 [8];
  MessageGenerator generator;
  Printer printer;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> output;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  string filename;
  offset_in_MessageGenerator_to_subr pfn_local;
  string *name_suffix_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *file_list_local;
  GeneratorContext *context_local;
  Descriptor *descriptor_local;
  string *java_package_local;
  string *package_dir_local;
  
  filename.field_2._8_8_ = name_suffix;
  psVar1 = Descriptor::name_abi_cxx11_((Descriptor *)java_package);
  std::operator+(&local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
                 ,psVar1);
  std::operator+(&local_88,&local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)file_list);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 &local_88,".java");
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)context,(value_type *)local_68);
  pZVar2 = (ZeroCopyOutputStream *)(**(code **)(*(long *)descriptor + 0x10))(descriptor,local_68);
  internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::scoped_ptr
            ((scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> *)&printer.at_start_of_line_,
             pZVar2);
  pZVar2 = internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::get
                     ((scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> *)
                      &printer.at_start_of_line_);
  io::Printer::Printer((Printer *)&generator.field_generators_.extension_generators_,pZVar2,'$');
  this_00 = Descriptor::file((Descriptor *)java_package);
  psVar1 = FileDescriptor::name_abi_cxx11_(this_00);
  io::Printer::Print((Printer *)&generator.field_generators_.extension_generators_,
                     "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
                     ,"filename",psVar1);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    io::Printer::Print((Printer *)&generator.field_generators_.extension_generators_,
                       "package $package$;\n\n","package",package_dir);
  }
  MessageGenerator::MessageGenerator((MessageGenerator *)local_128,(Descriptor *)java_package);
  if ((filename.field_2._8_8_ & 1) == 0) {
    local_178 = (code *)filename.field_2._8_8_;
  }
  else {
    local_178 = *(code **)(*(long *)(local_128 + pfn) + filename.field_2._8_8_ + -1);
  }
  (*local_178)(local_128 + pfn,&generator.field_generators_.extension_generators_);
  MessageGenerator::~MessageGenerator((MessageGenerator *)local_128);
  io::Printer::~Printer((Printer *)&generator.field_generators_.extension_generators_);
  internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::~scoped_ptr
            ((scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> *)&printer.at_start_of_line_);
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

static void GenerateSibling(const string& package_dir,
                            const string& java_package,
                            const DescriptorClass* descriptor,
                            GeneratorContext* context,
                            vector<string>* file_list,
                            const string& name_suffix,
                            void (GeneratorClass::*pfn)(io::Printer* printer)) {
  string filename = package_dir + descriptor->name() + name_suffix + ".java";
  file_list->push_back(filename);

  scoped_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
  io::Printer printer(output.get(), '$');

  printer.Print(
    "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
    "// source: $filename$\n"
    "\n",
    "filename", descriptor->file()->name());
  if (!java_package.empty()) {
    printer.Print(
      "package $package$;\n"
      "\n",
      "package", java_package);
  }

  GeneratorClass generator(descriptor);
  (generator.*pfn)(&printer);
}